

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcCom.c
# Opt level: O1

int Abc_CommandMemAbs2(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  int iVar2;
  uint nFrames;
  Wlc_Ntk_t *pWVar3;
  char *pcVar4;
  uint fVerbose;
  
  pWVar3 = (Wlc_Ntk_t *)pAbc->pAbcWlc;
  nFrames = 0;
  Extra_UtilGetoptReset();
  fVerbose = 0;
  while( true ) {
    while (iVar2 = Extra_UtilGetopt(argc,argv,"Fvh"), iVar1 = globalUtilOptind, iVar2 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar2 == -1) {
      if (pWVar3 != (Wlc_Ntk_t *)0x0) {
        pWVar3 = Wlc_NtkAbstractMem(pWVar3,nFrames,fVerbose);
        if ((Wlc_Ntk_t *)pAbc->pAbcWlc != (Wlc_Ntk_t *)0x0) {
          Wlc_NtkFree((Wlc_Ntk_t *)pAbc->pAbcWlc);
        }
        pAbc->pAbcWlc = pWVar3;
        return 0;
      }
      Abc_Print(1,"Abc_CommandMemAbs2(): There is no current design.\n");
      return 0;
    }
    if (iVar2 != 0x46) goto LAB_00355d30;
    if (argc <= globalUtilOptind) break;
    nFrames = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar1 + 1;
    if ((int)nFrames < 1) {
LAB_00355d30:
      Abc_Print(-2,"usage: %%memabs2 [-F num] [-vh]\n");
      Abc_Print(-2,"\t         memory abstraction for word-level networks\n");
      Abc_Print(-2,"\t-F num : the number of timeframes [default = %d]\n",(ulong)nFrames);
      pcVar4 = "yes";
      if (fVerbose == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar4);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-I\" should be followed by an integer.\n");
  goto LAB_00355d30;
}

Assistant:

int Abc_CommandMemAbs2( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Wlc_Ntk_t * pNtk = Wlc_AbcGetNtk(pAbc);
    int c, nFrames = 0, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Fvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            nFrames = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFrames <= 0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( 1, "Abc_CommandMemAbs2(): There is no current design.\n" );
        return 0;
    }
    pNtk = Wlc_NtkAbstractMem( pNtk, nFrames, fVerbose );
    Wlc_AbcUpdateNtk( pAbc, pNtk );
    return 0;
usage:
    Abc_Print( -2, "usage: %%memabs2 [-F num] [-vh]\n" );
    Abc_Print( -2, "\t         memory abstraction for word-level networks\n" );
    Abc_Print( -2, "\t-F num : the number of timeframes [default = %d]\n",  nFrames );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}